

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Terrain.cpp
# Opt level: O3

bool loadLebReductionPrepassProgram(void)

{
  bool bVar1;
  GLenum GVar2;
  djg_program *program;
  bool bVar3;
  
  program = (djg_program *)calloc(1,0x10);
  fwrite("Loading {Reduction-Prepass-Program}\n",0x24,1,_stdout);
  fflush(_stdout);
  bVar3 = false;
  djgp_push_string(program,"#define LEB_BUFFER_COUNT 1\n");
  djgp_push_string(program,"#define BUFFER_BINDING_LEB %i\n",0);
  djgp_push_string(program,"#define LEB_REDUCTION_PREPASS\n");
  djgp_push_file(program,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/LongestEdgeBisection/GLSL/LongestEdgeBisection.glsl"
                );
  djgp_push_file(program,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/LongestEdgeBisection/GLSL/LongestEdgeBisectionSumReduction.glsl"
                );
  bVar1 = djgp_to_gl(program,0x1c2,false,true,g_gl.programs + 6);
  djgp_release(program);
  if (bVar1) {
    GVar2 = (*glad_glGetError)();
    bVar3 = GVar2 == 0;
  }
  return bVar3;
}

Assistant:

float computeLodFactor()
{
    if (g_camera.projection == PROJECTION_RECTILINEAR) {
        float tmp = 2.0f * tan(radians(g_camera.fovy) / 2.0f)
            / g_framebuffer.h * (1 << g_terrain.gpuSubd)
            * g_terrain.primitivePixelLengthTarget;

        return -2.0f * std::log2(tmp) + 2.0f;
    } else if (g_camera.projection == PROJECTION_ORTHOGRAPHIC) {
        float planeSize = 2.0f * tan(radians(g_camera.fovy / 2.0f));
        float targetSize = planeSize * g_terrain.primitivePixelLengthTarget
                         / g_framebuffer.h * (1 << g_terrain.gpuSubd);

        return -2.0f * std::log2(targetSize);
    } else if (g_camera.projection == PROJECTION_FISHEYE) {
        return 1.0f;
    }

    return 1.0f;
}